

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xatlas.cpp
# Opt level: O0

void xatlas::internal::param::setup_abf_relations
               (Matrix *A,int row,int id0,int id1,int id2,Vector3 *p0,Vector3 *p1,Vector3 *p2)

{
  uint32_t x;
  uint32_t x_00;
  uint32_t x_01;
  uint32_t x_02;
  uint32_t x_03;
  int iVar1;
  float fVar2;
  float local_6c;
  int v2_id;
  int u2_id;
  int v1_id;
  int u1_id;
  int v0_id;
  int u0_id;
  float sine;
  float cosine;
  float ratio;
  float c0;
  float s2;
  float s1;
  float s0;
  float a2;
  float a1;
  float a0;
  Vector3 *p0_local;
  int id2_local;
  int id1_local;
  int id0_local;
  int row_local;
  Matrix *A_local;
  
  _a1 = p0;
  p0_local._0_4_ = id2;
  p0_local._4_4_ = id1;
  id2_local = id0;
  id1_local = row;
  _id0_local = A;
  triangle_angles(p0,p1,p2,&a2,&s0,&s1);
  s2 = sinf(a2);
  c0 = sinf(s0);
  ratio = sinf(s1);
  if ((c0 <= s2) || (c0 <= ratio)) {
    if ((c0 < s2) && (ratio < s2)) {
      swap<float>(&s2,&ratio);
      swap<float>(&s2,&c0);
      swap<float>(&a2,&s1);
      swap<float>(&a2,&s0);
      swap<int>(&id2_local,(int *)&p0_local);
      swap<int>(&id2_local,(int *)((long)&p0_local + 4));
    }
  }
  else {
    swap<float>(&c0,&ratio);
    swap<float>(&s2,&c0);
    swap<float>(&s0,&s1);
    swap<float>(&a2,&s0);
    swap<int>((int *)((long)&p0_local + 4),(int *)&p0_local);
    swap<int>(&id2_local,(int *)((long)&p0_local + 4));
  }
  fVar2 = cosf(a2);
  if ((ratio != 0.0) || (NAN(ratio))) {
    local_6c = c0 / ratio;
  }
  else {
    local_6c = 1.0;
  }
  fVar2 = fVar2 * local_6c;
  local_6c = s2 * local_6c;
  x = id2_local << 1;
  x_00 = id2_local * 2 + 1;
  x_01 = p0_local._4_4_ << 1;
  x_02 = p0_local._4_4_ * 2 + 1;
  x_03 = (int)p0_local << 1;
  iVar1 = (int)p0_local * 2;
  sparse::Matrix::setCoefficient(_id0_local,x,id1_local << 1,fVar2 - 1.0);
  sparse::Matrix::setCoefficient(_id0_local,x_00,id1_local << 1,-local_6c);
  sparse::Matrix::setCoefficient(_id0_local,x_01,id1_local << 1,-fVar2);
  sparse::Matrix::setCoefficient(_id0_local,x_02,id1_local << 1,local_6c);
  sparse::Matrix::setCoefficient(_id0_local,x_03,id1_local << 1,1.0);
  sparse::Matrix::setCoefficient(_id0_local,x,id1_local * 2 + 1,local_6c);
  sparse::Matrix::setCoefficient(_id0_local,x_00,id1_local * 2 + 1,fVar2 - 1.0);
  sparse::Matrix::setCoefficient(_id0_local,x_01,id1_local * 2 + 1,-local_6c);
  sparse::Matrix::setCoefficient(_id0_local,x_02,id1_local * 2 + 1,-fVar2);
  sparse::Matrix::setCoefficient(_id0_local,iVar1 + 1,id1_local * 2 + 1,1.0);
  return;
}

Assistant:

static void setup_abf_relations(sparse::Matrix &A, int row, int id0, int id1, int id2, const Vector3 &p0, const Vector3 &p1, const Vector3 &p2)
{
	// @@ IC: Wouldn't it be more accurate to return cos and compute 1-cos^2?
	// It does indeed seem to be a little bit more robust.
	// @@ Need to revisit this more carefully!
	float a0, a1, a2;
	triangle_angles(p0, p1, p2, &a0, &a1, &a2);
	float s0 = sinf(a0);
	float s1 = sinf(a1);
	float s2 = sinf(a2);
	if (s1 > s0 && s1 > s2) {
		swap(s1, s2);
		swap(s0, s1);
		swap(a1, a2);
		swap(a0, a1);
		swap(id1, id2);
		swap(id0, id1);
	} else if (s0 > s1 && s0 > s2) {
		swap(s0, s2);
		swap(s0, s1);
		swap(a0, a2);
		swap(a0, a1);
		swap(id0, id2);
		swap(id0, id1);
	}
	float c0 = cosf(a0);
	float ratio = (s2 == 0.0f) ? 1.0f : s1 / s2;
	float cosine = c0 * ratio;
	float sine = s0 * ratio;
	// Note  : 2*id + 0 --> u
	//         2*id + 1 --> v
	int u0_id = 2 * id0 + 0;
	int v0_id = 2 * id0 + 1;
	int u1_id = 2 * id1 + 0;
	int v1_id = 2 * id1 + 1;
	int u2_id = 2 * id2 + 0;
	int v2_id = 2 * id2 + 1;
	// Real part
	A.setCoefficient(u0_id, 2 * row + 0, cosine - 1.0f);
	A.setCoefficient(v0_id, 2 * row + 0, -sine);
	A.setCoefficient(u1_id, 2 * row + 0, -cosine);
	A.setCoefficient(v1_id, 2 * row + 0, sine);
	A.setCoefficient(u2_id, 2 * row + 0, 1);
	// Imaginary part
	A.setCoefficient(u0_id, 2 * row + 1, sine);
	A.setCoefficient(v0_id, 2 * row + 1, cosine - 1.0f);
	A.setCoefficient(u1_id, 2 * row + 1, -sine);
	A.setCoefficient(v1_id, 2 * row + 1, -cosine);
	A.setCoefficient(v2_id, 2 * row + 1, 1);
}